

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O2

void __thiscall logfault::LogManager::LogMessage(LogManager *this,Message *message)

{
  pointer puVar1;
  Handler *pHVar2;
  unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_> *h;
  pointer puVar3;
  
  std::mutex::lock(&this->mutex_);
  puVar1 = (this->handlers_).
           super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->handlers_).
                super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pHVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<logfault::Handler,_std::default_delete<logfault::Handler>_>._M_t.
             super__Tuple_impl<0UL,_logfault::Handler_*,_std::default_delete<logfault::Handler>_>.
             super__Head_base<0UL,_logfault::Handler_*,_false>._M_head_impl;
    if ((int)message->level_ <= (int)pHVar2->level_) {
      (*pHVar2->_vptr_Handler[2])(pHVar2,message);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void LogMessage(Message message) {
            std::lock_guard<std::mutex> lock{mutex_};
            for(const auto& h : handlers_) {
                if (h->level_ >= message.level_) {
                    h->LogMessage(message);
                }
            }
        }